

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

char * apx_file_type_to_extension(apx_fileType_t file_type)

{
  if ((byte)(file_type - 1) < 5) {
    return &DAT_001411a4 + *(int *)(&DAT_001411a4 + (ulong)(byte)(file_type - 1) * 4);
  }
  return "";
}

Assistant:

char const* apx_file_type_to_extension(apx_fileType_t file_type)
{
   switch (file_type)
   {
   case APX_DEFINITION_FILE_TYPE:
      return APX_DEFINITION_FILE_EXT;
   case APX_PROVIDE_PORT_DATA_FILE_TYPE:
      return APX_PROVIDE_PORT_DATA_EXT;
   case APX_REQUIRE_PORT_DATA_FILE_TYPE:
      return APX_REQUIRE_PORT_DATA_EXT;
   case APX_PROVIDE_PORT_COUNT_FILE_TYPE:
      return APX_PROVIDE_PORT_COUNT_EXT;
   case APX_REQUIRE_PORT_COUNT_FILE_TYPE:
      return APX_REQUIRE_PORT_COUNT_EXT;
   }
   return "";
}